

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Slacking::~Slacking(Slacking *this)

{
  CategoryWebHook::~CategoryWebHook(&this->hook);
  CategoryChat::~CategoryChat(&this->chat);
  std::__cxx11::string::~string((string *)&this->token_);
  Session::~Session(&this->session_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Slacking(const std::string& token, bool throw_exception = true) 
    : session_{throw_exception}, token_{token}, throw_exception_{throw_exception}
    {
        session_.SetUrl("https://slack.com/api/");
        session_.SetToken(token_);
    }